

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

int buffer_get(void *data)

{
  byte bVar1;
  ulong uVar2;
  
  uVar2 = *(ulong *)((long)data + 0x10);
  if (uVar2 < *(ulong *)((long)data + 8)) {
    bVar1 = *(byte *)(*data + uVar2);
    *(ulong *)((long)data + 0x10) = uVar2 + 1;
    return (int)bVar1;
  }
  return -1;
}

Assistant:

static int buffer_get(void *data)
{
	char c;
	buffer_data_t *stream = data;
	if (stream->pos >= stream->len)
		return EOF;

	c = stream->data[stream->pos];
	stream->pos++;
	return (unsigned char)c;
}